

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

Tour * tour_copy(Tour *__return_storage_ptr__,Tour *other)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int32_t *piVar3;
  
  uVar1 = other->num_customers;
  uVar2 = other->num_comps;
  __return_storage_ptr__->num_customers = uVar1;
  __return_storage_ptr__->num_comps = uVar2;
  piVar3 = veci32_copy(other->succ,uVar1 + 1);
  __return_storage_ptr__->succ = piVar3;
  piVar3 = veci32_copy(other->comp,uVar1 + 1);
  __return_storage_ptr__->comp = piVar3;
  return __return_storage_ptr__;
}

Assistant:

Tour tour_copy(Tour const *other) {
    Tour result = {0};
    result.num_customers = other->num_customers;

    result.num_comps = other->num_comps;
    result.succ = veci32_copy(other->succ, result.num_customers + 1);
    result.comp = veci32_copy(other->comp, result.num_customers + 1);
    return result;
}